

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  iterator iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FILE *__stream;
  pointer piVar4;
  pointer piVar5;
  int32_t iVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  id iVar11;
  int iVar12;
  int64_t iVar13;
  int64_t iVar14;
  char *pcVar15;
  mapped_type *pmVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  long lVar21;
  int iVar22;
  float fVar23;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> embd;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<int,_std::allocator<int>_> last_n_tokens;
  int n_read;
  size_t mem_per_token;
  vector<int,_std::allocator<int>_> response_inp;
  vector<int,_std::allocator<int>_> prompt_inp;
  vector<float,_std::allocator<float>_> logits;
  vector<int,_std::allocator<int>_> line_inp;
  vector<int,_std::allocator<int>_> instruct_inp;
  vector<int,_std::allocator<int>_> param_inp;
  gpt_vocab vocab;
  id id;
  mt19937 rng;
  int local_17b4;
  int local_17ac;
  vector<int,_std::allocator<int>_> local_17a8;
  void *local_1788;
  long lStack_1780;
  long local_1778;
  uint local_1764;
  vector<int,_std::allocator<int>_> local_1760;
  int local_1744;
  long local_1740;
  long local_1738;
  ulong local_1730;
  size_t local_1728;
  float local_1720;
  float local_171c;
  vector<int,_std::allocator<int>_> local_1718;
  vector<int,_std::allocator<int>_> local_1700;
  vector<float,_std::allocator<float>_> local_16e8;
  vector<int,_std::allocator<int>_> local_16c8;
  vector<int,_std::allocator<int>_> local_16b0;
  gpt_params local_1698;
  string local_1608;
  ulong local_15e0;
  int64_t local_15d8;
  vector<int,_std::allocator<int>_> local_15d0;
  gpt_vocab local_15b8;
  string local_1558 [8];
  llama_model local_1458;
  mt19937 local_13b8;
  
  ggml_time_init();
  local_15d8 = ggml_time_us();
  local_1698.seed = -1;
  uVar9 = std::thread::hardware_concurrency();
  local_1698.n_threads = 4;
  if ((int)uVar9 < 4) {
    local_1698.n_threads = uVar9;
  }
  local_1698.n_predict = 0x80;
  local_1698.repeat_last_n = 0x40;
  local_1698.n_ctx = 0x800;
  local_1698.top_k = 0x28;
  local_1698.top_p = 0.95;
  local_1698.temp = 0.1;
  local_1698.repeat_penalty = 1.3;
  local_1698.n_batch = 8;
  local_1698.model._M_dataplus._M_p = (pointer)&local_1698.model.field_2;
  local_13b8._M_x[0] = 0x15;
  local_1698.model._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_1698.model,local_13b8._M_x,0);
  local_1698.model.field_2._M_allocated_capacity = local_13b8._M_x[0];
  builtin_strncpy(local_1698.model._M_dataplus._M_p,"ggml-alpaca-7b-q4.bin",0x15);
  local_1698.model._M_string_length = local_13b8._M_x[0];
  local_1698.model._M_dataplus._M_p[local_13b8._M_x[0]] = '\0';
  paVar2 = &local_1698.prompt.field_2;
  local_1698.prompt._M_string_length = 0;
  local_1698.prompt.field_2._M_local_buf[0] = '\0';
  local_1698.use_color = true;
  local_1698.interactive = true;
  local_1698.interactive_start = true;
  local_1698.antiprompt._M_dataplus._M_p = (pointer)&local_1698.antiprompt.field_2;
  local_1698.antiprompt._M_string_length = 0;
  local_1698.antiprompt.field_2._M_local_buf[0] = '\0';
  local_1698.prompt._M_dataplus._M_p = (pointer)paVar2;
  bVar7 = gpt_params_parse(argc,argv,&local_1698);
  uVar9 = 1;
  if (bVar7) {
    main_cold_1();
    local_13b8._M_p = 0x270;
    local_15b8.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_15b8.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    local_15b8.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_15b8.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_15b8.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_15b8.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_15b8.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    local_15b8.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_15b8.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_15b8.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1458.tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1458.tensors._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1458.hparams.n_vocab = 32000;
    local_1458.hparams.n_ctx = 0x200;
    local_1458.hparams.n_embd = 0x1000;
    local_1458.hparams.n_mult = 0x100;
    local_1458.hparams.n_head = 0x20;
    local_1458.hparams.n_layer = 0x20;
    local_1458.hparams.n_rot = 0x40;
    local_1458.hparams.f16 = 1;
    local_1458.layers.super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1458.layers.super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1458.layers.super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1458.tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1458.tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1458.tensors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_15b8.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_15b8.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_15b8.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_15b8.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1458.tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1458.tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar13 = ggml_time_us();
    bVar7 = llama_model_load(&local_1698.model,&local_1458,&local_15b8,local_1698.n_ctx);
    if (!bVar7) {
      main_cold_2();
      fVar23 = 0.0;
    }
    else {
      iVar14 = ggml_time_us();
      fVar23 = (float)(iVar14 - iVar13);
    }
    uVar9 = (uint)!bVar7;
    if (bVar7) {
      local_1720 = fVar23;
      fputc(10,_stderr);
      iVar6 = local_1698.n_threads;
      __stream = _stderr;
      uVar10 = std::thread::hardware_concurrency();
      pcVar15 = llama_print_system_info();
      fprintf(__stream,"system_info: n_threads = %d / %d | %s\n",(ulong)(uint)iVar6,(ulong)uVar10,
              pcVar15);
      local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1778 = 0;
      local_1788 = (void *)0x0;
      lStack_1780 = 0;
      paVar3 = &local_1558[0].field_2;
      local_1558[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1558,
                 " Below is an instruction that describes a task. Write a response that appropriately completes the request.\n\n"
                 ,"");
      llama_tokenize(&local_16b0,&local_15b8,local_1558,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1558[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_1558[0]._M_dataplus._M_p,
                        local_1558[0].field_2._M_allocated_capacity + 1);
      }
      local_1558[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1558,"### Instruction:\n\n","");
      llama_tokenize(&local_1700,&local_15b8,local_1558,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1558[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_1558[0]._M_dataplus._M_p,
                        local_1558[0].field_2._M_allocated_capacity + 1);
      }
      local_1558[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"### Response:\n\n","");
      llama_tokenize(&local_1718,&local_15b8,local_1558,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1558[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_1558[0]._M_dataplus._M_p,
                        local_1558[0].field_2._M_allocated_capacity + 1);
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&local_1788,lStack_1780,
                 local_16b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_16b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_1698.prompt._M_string_length != 0) {
        llama_tokenize(&local_15d0,&local_15b8,&local_1698.prompt,true);
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_1788,lStack_1780,
                   local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_1788,lStack_1780,
                   local_15d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_15d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&local_1788,lStack_1780,
                   local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        main_cold_4();
      }
      if (local_1698.interactive == true) {
        main_cold_3();
      }
      fprintf(_stderr,
              "sampling parameters: temp = %f, top_k = %d, top_p = %f, repeat_last_n = %i, repeat_penalty = %f\n"
              ,SUB84((double)local_1698.temp,0),(double)local_1698.top_p,
              (double)local_1698.repeat_penalty,(ulong)local_1698._16_8_ >> 0x20,
              (ulong)local_1698._8_8_ >> 0x20);
      fwrite("\n\n",2,1,_stderr);
      iVar6 = local_1698.n_threads;
      local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1728 = 0;
      local_1608._M_dataplus._M_p = (pointer)0x100000000;
      local_1608._M_string_length = 0x300000002;
      __l._M_len = 4;
      __l._M_array = (iterator)&local_1608;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_1558,__l,(allocator_type *)&local_1760);
      llama_eval(&local_1458,iVar6,0,(vector<int,_std::allocator<int>_> *)local_1558,&local_16e8,
                 &local_1728);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1558[0]._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_1558[0]._M_dataplus._M_p,
                        local_1558[0].field_2._M_allocated_capacity -
                        (long)local_1558[0]._M_dataplus._M_p);
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1760,(long)local_1698.repeat_last_n,(allocator_type *)local_1558);
      if (local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        memset(local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               ((long)local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (-4 - (long)local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
      }
      if (local_1698.interactive == true) {
        main_cold_5();
      }
      if (local_1698.interactive_start == true) {
        is_interacting = '\x01';
      }
      iVar22 = local_1458.hparams.n_ctx - (int)((ulong)(lStack_1780 - (long)local_1788) >> 2);
      if (local_1698.use_color == true) {
        printf("\x1b[33m");
      }
      if (iVar22 < 1) {
        local_1738 = 0;
        local_1740 = 0;
        local_17ac = 0;
      }
      else {
        bVar7 = true;
        local_17ac = 0;
        local_1740 = 0;
        local_1738 = 0;
        local_17b4 = 0;
        do {
          if (local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            iVar13 = ggml_time_us();
            bVar8 = llama_eval(&local_1458,local_1698.n_threads,local_17ac,&local_17a8,&local_16e8,
                               &local_1728);
            if (!bVar8) {
              main_cold_6();
              uVar9 = 1;
              goto LAB_0010eee2;
            }
            iVar14 = ggml_time_us();
            local_1738 = (local_1738 - iVar13) + iVar14;
          }
          local_15e0 = (long)local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
          if (local_15e0 != 0) {
            local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          uVar19 = (ulong)local_17b4;
          local_1764 = uVar9;
          if ((uVar19 < (ulong)(lStack_1780 - (long)local_1788 >> 2)) || (is_interacting != '\0')) {
            lVar21 = uVar19 * 4;
            do {
              if ((ulong)(lStack_1780 - (long)local_1788 >> 2) <= uVar19) break;
              if (local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_17a8,
                           (iterator)
                           local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)((long)local_1788 + lVar21));
              }
              else {
                *local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = *(int *)((long)local_1788 + lVar21);
                local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              piVar20 = local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 1;
              if (piVar20 !=
                  local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                memmove(local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,piVar20,
                        (long)local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar20);
              }
              iVar1._M_current =
                   local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
              if (iVar1._M_current ==
                  local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar1._M_current;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_1760,iVar1,
                           (int *)((long)local_1788 + lVar21));
              }
              else {
                local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] = *(int *)((long)local_1788 + lVar21);
              }
              uVar19 = uVar19 + 1;
              lVar21 = lVar21 + 4;
            } while ((ulong)((long)local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2) <=
                     (ulong)(long)local_1698.n_batch);
            local_17b4 = (int)uVar19;
            if (((!bVar7) && (local_1698.use_color == true)) &&
               (lStack_1780 - (long)local_1788 >> 2 == (long)local_17b4)) {
              printf("\x1b[0m");
            }
          }
          else {
            iVar6 = local_1698.top_k;
            fVar23 = local_1698.top_p;
            local_1730 = CONCAT44(local_1730._4_4_,local_1698.temp);
            local_171c = local_1698.repeat_penalty;
            lVar21 = (long)local_1458.hparams.n_vocab;
            local_1558[0]._M_dataplus._M_p = local_1558[0]._M_dataplus._M_p & 0xffffffff00000000;
            iVar13 = ggml_time_us();
            iVar11 = llama_sample_top_p_top_k
                               (&local_15b8,
                                local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_start +
                                (((ulong)((long)local_16e8.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_16e8.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 2) -
                                lVar21),&local_1760,(double)local_171c,(int)(float)iVar6,
                                (double)fVar23,(double)(float)local_1730,&local_13b8);
            local_1558[0]._M_dataplus._M_p._0_4_ = iVar11;
            piVar20 = local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
            if (piVar20 !=
                local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              memmove(local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,piVar20,
                      (long)local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar20);
            }
            iVar1._M_current =
                 local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            if (iVar1._M_current ==
                local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar1._M_current;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1760,iVar1,(int *)local_1558);
            }
            else {
              local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] = (id)local_1558[0]._M_dataplus._M_p;
            }
            iVar14 = ggml_time_us();
            if (local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_17a8,
                         (iterator)
                         local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_1558);
            }
            else {
              *local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = (id)local_1558[0]._M_dataplus._M_p;
              local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_1740 = (local_1740 - iVar13) + iVar14;
            iVar22 = iVar22 + -1;
            bVar7 = false;
            uVar9 = local_1764;
          }
          piVar4 = local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar20 = local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (!bVar7) {
            for (; piVar20 != piVar4; piVar20 = piVar20 + 1) {
              local_1558[0]._M_dataplus._M_p._0_4_ = *piVar20;
              pmVar16 = std::
                        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_15b8.id_to_token,(key_type *)local_1558);
              printf("%s",(pmVar16->_M_dataplus)._M_p);
            }
            fflush(_stdout);
          }
          if (local_1698.interactive == true) {
            uVar19 = lStack_1780 - (long)local_1788 >> 2;
            if ((uVar19 <= (ulong)(long)local_17b4) && (is_interacting == '\x01')) {
              local_1730 = uVar19;
              std::vector<int,std::allocator<int>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        ((vector<int,std::allocator<int>> *)&local_1788,
                         (long)local_1788 + (lStack_1780 - (long)local_1788),
                         local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
              printf("\n> ");
              do {
                fflush(_stdout);
                memset(local_1558,0,0x100);
                if (local_1698.use_color == true) {
                  printf("\x1b[1m\x1b[32m");
                }
                iVar12 = __isoc99_scanf("%255[^\n]%n%*c",local_1558,&local_1744);
                if (iVar12 < 1) {
                  __isoc99_scanf("%*c");
                  local_1744 = 0;
                }
                if (local_1698.use_color == true) {
                  printf("\x1b[0m");
                }
                lVar21 = (long)local_1744;
                if ((lVar21 < 1) ||
                   (*(char *)((long)&local_1558[0]._M_dataplus._M_p + (ulong)(local_1744 - 1)) !=
                    '\\')) {
                  *(undefined1 *)((long)&local_1558[0]._M_dataplus._M_p + lVar21) = 10;
                  lVar21 = lVar21 + 1;
                  bVar7 = false;
                }
                else {
                  *(undefined1 *)((long)&local_1558[0]._M_dataplus._M_p + (ulong)(local_1744 - 1)) =
                       10;
                  bVar7 = true;
                }
                *(undefined1 *)((long)&local_1558[0]._M_dataplus._M_p + lVar21) = 0;
                local_1608._M_dataplus._M_p = (pointer)&local_1608.field_2;
                sVar17 = strlen((char *)local_1558);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1608,local_1558,
                           (long)&local_1558[0]._M_dataplus._M_p + sVar17);
                llama_tokenize(&local_16c8,&local_15b8,&local_1608,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1608._M_dataplus._M_p != &local_1608.field_2) {
                  operator_delete(local_1608._M_dataplus._M_p,
                                  local_1608.field_2._M_allocated_capacity + 1);
                }
                std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)&local_1788,lStack_1780,
                           local_16c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_16c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)&local_1788,lStack_1780,
                           local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
                piVar5 = local_16c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                piVar4 = local_16c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar18 = (long)local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                uVar19 = (long)local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                if (local_16c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_16c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_16c8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_16c8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                iVar22 = iVar22 - ((int)(uVar19 >> 2) +
                                  (int)((ulong)((long)piVar5 - (long)piVar4) >> 2) +
                                  (int)(uVar18 >> 2));
              } while (bVar7);
              is_interacting = '\0';
              bVar7 = true;
              local_17b4 = (int)local_1730;
              uVar9 = local_1764;
            }
          }
          local_17ac = local_17ac + (int)(local_15e0 >> 2);
          if (local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] == 2) {
            if (local_1698.interactive != true) {
              main_cold_7();
              break;
            }
            is_interacting = '\x01';
          }
        } while (0 < iVar22);
      }
      iVar13 = ggml_time_us();
      fwrite("\n\n",2,1,_stderr);
      uVar9 = 0;
      fprintf(_stderr,"%s: mem per token = %8zu bytes\n","main",local_1728);
      fprintf(_stderr,"%s:     load time = %8.2f ms\n",SUB84((double)(local_1720 / 1000.0),0),"main"
             );
      fprintf(_stderr,"%s:   sample time = %8.2f ms\n",SUB84((double)((float)local_1740 / 1000.0),0)
              ,"main");
      fprintf(_stderr,"%s:  predict time = %8.2f ms / %.2f ms per token\n",
              SUB84((double)((float)local_1738 / 1000.0),0),
              (double)(((float)local_1738 / 1000.0) / (float)local_17ac),"main");
      fprintf(_stderr,"%s:    total time = %8.2f ms\n",
              SUB84((double)((float)(iVar13 - local_15d8) / 1000.0),0),"main");
      ggml_free(local_1458.ctx);
      if (local_1698.use_color == true) {
        uVar9 = 0;
        printf("\x1b[0m");
      }
LAB_0010eee2:
      if (local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1760.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_17a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_16b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_16b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_16b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_16b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1788 != (void *)0x0) {
        operator_delete(local_1788,local_1778 - (long)local_1788);
      }
      if (local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
    ::~_Rb_tree(&local_1458.tensors._M_t);
    if (local_1458.layers.super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1458.layers.
                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1458.layers.
                            super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1458.layers.
                            super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_15b8.id_to_token._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&local_15b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698.antiprompt._M_dataplus._M_p != &local_1698.antiprompt.field_2) {
    operator_delete(local_1698.antiprompt._M_dataplus._M_p,
                    CONCAT71(local_1698.antiprompt.field_2._M_allocated_capacity._1_7_,
                             local_1698.antiprompt.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698.prompt._M_dataplus._M_p != paVar2) {
    operator_delete(local_1698.prompt._M_dataplus._M_p,
                    CONCAT71(local_1698.prompt.field_2._M_allocated_capacity._1_7_,
                             local_1698.prompt.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698.model._M_dataplus._M_p != &local_1698.model.field_2) {
    operator_delete(local_1698.model._M_dataplus._M_p,
                    local_1698.model.field_2._M_allocated_capacity + 1);
  }
  return uVar9;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();
    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    fprintf(stderr, "%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    // if (params.prompt.empty()) {
    //     params.prompt = gpt_random_prompt(rng);
    // }

//    params.prompt = R"(// this function checks if the number n is prime
//bool is_prime(int n) {)";

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    llama_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();
        if (!llama_model_load(params.model, model, vocab, params.n_ctx)) {  
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;
    }

    // print system information
    {
        fprintf(stderr, "\n");
        fprintf(stderr, "system_info: n_threads = %d / %d | %s\n",
                params.n_threads, std::thread::hardware_concurrency(), llama_print_system_info());
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // Add a space in front of the first character to match OG llama tokenizer behavior
    // params.prompt.insert(0, 1, ' ');
    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp;

    // params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    // // tokenize the reverse prompt
    // std::vector<gpt_vocab::id> antiprompt_inp = ::llama_tokenize(vocab, params.antiprompt, false);


    std::vector<gpt_vocab::id> instruct_inp = ::llama_tokenize(vocab, " Below is an instruction that describes a task. Write a response that appropriately completes the request.\n\n", true);
    std::vector<gpt_vocab::id> prompt_inp = ::llama_tokenize(vocab, "### Instruction:\n\n", true);
    std::vector<gpt_vocab::id> response_inp = ::llama_tokenize(vocab, "### Response:\n\n", false);
    embd_inp.insert(embd_inp.end(), instruct_inp.begin(), instruct_inp.end());

    if(!params.prompt.empty()) {
        std::vector<gpt_vocab::id> param_inp = ::llama_tokenize(vocab, params.prompt, true);
        embd_inp.insert(embd_inp.end(), prompt_inp.begin(), prompt_inp.end());
        embd_inp.insert(embd_inp.end(), param_inp.begin(), param_inp.end());
        embd_inp.insert(embd_inp.end(), response_inp.begin(), response_inp.end());
    }

    // fprintf(stderr, "\n");
    // fprintf(stderr, "%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    // fprintf(stderr, "%s: number of tokens in prompt = %zu\n", __func__, embd_inp.size());
    // for (int i = 0; i < (int) embd_inp.size(); i++) {
    //     fprintf(stderr, "%6d -> '%s'\n", embd_inp[i], vocab.id_to_token.at(embd_inp[i]).c_str());
    // }
    // fprintf(stderr, "\n");

    if (params.interactive) {
#if defined (__unix__) || (defined (__APPLE__) && defined (__MACH__))
        struct sigaction sigint_action;
        sigint_action.sa_handler = sigint_handler;
        sigemptyset (&sigint_action.sa_mask);
        sigint_action.sa_flags = 0;
        sigaction(SIGINT, &sigint_action, NULL);
#elif defined (_WIN32)
        signal(SIGINT, sigint_handler);

        // Windows console ANSI color fix
        DWORD mode = 0;
        HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
        if (hConsole && hConsole != INVALID_HANDLE_VALUE && GetConsoleMode(hConsole, &mode)){
            SetConsoleMode(hConsole, mode | ENABLE_VIRTUAL_TERMINAL_PROCESSING);
            SetConsoleOutputCP(CP_UTF8);
        }
#endif

        fprintf(stderr, "%s: interactive mode on.\n", __func__);

        // if(antiprompt_inp.size()) {
        //     fprintf(stderr, "%s: reverse prompt: '%s'\n", __func__, params.antiprompt.c_str());
        //     fprintf(stderr, "%s: number of tokens in reverse prompt = %zu\n", __func__, antiprompt_inp.size());
        //     for (int i = 0; i < (int) antiprompt_inp.size(); i++) {
        //         fprintf(stderr, "%6d -> '%s'\n", antiprompt_inp[i], vocab.id_to_token.at(antiprompt_inp[i]).c_str());
        //     }
        //     fprintf(stderr, "\n");
        // }
    }
    fprintf(stderr, "sampling parameters: temp = %f, top_k = %d, top_p = %f, repeat_last_n = %i, repeat_penalty = %f\n", params.temp, params.top_k, params.top_p, params.repeat_last_n, params.repeat_penalty);
    fprintf(stderr, "\n\n");

    std::vector<gpt_vocab::id> embd;

    // determine the required inference memory per token:
    size_t mem_per_token = 0;
    llama_eval(model, params.n_threads, 0, { 0, 1, 2, 3 }, logits, mem_per_token);

    int last_n_size = params.repeat_last_n;
    std::vector<gpt_vocab::id> last_n_tokens(last_n_size);
    std::fill(last_n_tokens.begin(), last_n_tokens.end(), 0);


    if (params.interactive) {
        fprintf(stderr, "== Running in chat mode. ==\n"
#if defined (__unix__) || (defined (__APPLE__) && defined (__MACH__)) || defined (_WIN32)
               " - Press Ctrl+C to interject at any time.\n"
#endif
               " - Press Return to return control to LLaMA.\n"
               " - If you want to submit another line, end your input in '\\'.\n");
    }

    // we may want to slide the input window along with the context, but for now we restrict to the context length
    int remaining_tokens = model.hparams.n_ctx - embd_inp.size();
    int input_consumed = 0;
    bool input_noecho = true;

    // prompt user immediately after the starting prompt has been loaded
    if (params.interactive_start) {
        is_interacting = true;
    }

    // set the color for the prompt which will be output initially
    if (params.use_color) {
        printf(ANSI_COLOR_YELLOW);
    }

    

    while (remaining_tokens > 0) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!llama_eval(model, params.n_threads, n_past, embd, logits, mem_per_token)) {
                fprintf(stderr, "Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (embd_inp.size() <= input_consumed && !is_interacting) {
            // out of user input, sample next token
            const float top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;
            const float repeat_penalty = params.repeat_penalty;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = llama_sample_top_p_top_k(vocab, logits.data() + (logits.size() - n_vocab), last_n_tokens, repeat_penalty, top_k, top_p, temp, rng);

                last_n_tokens.erase(last_n_tokens.begin());
                last_n_tokens.push_back(id);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);

            // echo this to console
            input_noecho = false;

            // decrement remaining sampling budget
            --remaining_tokens;
        } else {
            // some user input remains from prompt or interaction, forward it to processing
            while (embd_inp.size() > input_consumed) {
                // fprintf(stderr, "%6d -> '%s'\n", embd_inp[input_consumed], vocab.id_to_token.at(embd_inp[input_consumed]).c_str());

                embd.push_back(embd_inp[input_consumed]);
                last_n_tokens.erase(last_n_tokens.begin());
                last_n_tokens.push_back(embd_inp[input_consumed]);
                ++input_consumed;
                if (embd.size() > params.n_batch) {
                    break;
                }
            }

            // reset color to default if we there is no pending user input
            if (!input_noecho && params.use_color && embd_inp.size() == input_consumed) {
                printf(ANSI_COLOR_RESET);
            }
        }

        // display text
        if (!input_noecho) {
            for (auto id : embd) {
                printf("%s", vocab.id_to_token[id].c_str());
            }
            fflush(stdout);
        }

        // in interactive mode, and not currently processing queued inputs;
        // check if we should prompt the user for more
        if (params.interactive && embd_inp.size() <= input_consumed) {
            // check for reverse prompt
            // if (antiprompt_inp.size() && std::equal(antiprompt_inp.rbegin(), antiprompt_inp.rend(), last_n_tokens.rbegin())) {
            //     // reverse prompt found
            //     is_interacting = true;
            // }
            if (is_interacting) {
                // input_consumed =  0;
                // embd_inp.erase(embd_inp.begin());
                input_consumed = embd_inp.size();
                embd_inp.insert(embd_inp.end(), prompt_inp.begin(), prompt_inp.end());
                

                printf("\n> ");

                // currently being interactive
                bool another_line=true;
                while (another_line) {
                    fflush(stdout);
                    char buf[256] = {0};
                    int n_read;
                    if(params.use_color) printf(ANSI_BOLD ANSI_COLOR_GREEN);
                    if (scanf("%255[^\n]%n%*c", buf, &n_read) <= 0) {
                        // presumable empty line, consume the newline
                        if (scanf("%*c") <= 0) { /*ignore*/ }
                        n_read=0;
                    }
                    if(params.use_color) printf(ANSI_COLOR_RESET);

                    if (n_read > 0 && buf[n_read-1]=='\\') {
                        another_line = true;
                        buf[n_read-1] = '\n';
                        buf[n_read] = 0;
                    } else {
                        another_line = false;
                        buf[n_read] = '\n';
                        buf[n_read+1] = 0;
                    }

                    std::vector<gpt_vocab::id> line_inp = ::llama_tokenize(vocab, buf, false);
                    embd_inp.insert(embd_inp.end(), line_inp.begin(), line_inp.end());
                    embd_inp.insert(embd_inp.end(), response_inp.begin(), response_inp.end());

                    remaining_tokens -= prompt_inp.size() + line_inp.size() + response_inp.size();

                    input_noecho = true; // do not echo this again
                }

                is_interacting = false;
            }
        }

        // end of text token
        if (embd.back() == 2) {
            if (params.interactive) {
                is_interacting = true;
                continue;
            } else {
                printf("\n");
                fprintf(stderr, " [end of text]\n");
                break;
            }
        }
    }

#if defined (_WIN32)
    signal(SIGINT, SIG_DFL);
#endif

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        fprintf(stderr, "\n\n");
        fprintf(stderr, "%s: mem per token = %8zu bytes\n", __func__, mem_per_token);
        fprintf(stderr, "%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        fprintf(stderr, "%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        fprintf(stderr, "%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        fprintf(stderr, "%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx);

    if (params.use_color) {
        printf(ANSI_COLOR_RESET);
    }

    return 0;
}